

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

offset_datetime_format_info * __thiscall
toml::basic_value<toml::type_config>::as_offset_datetime_fmt(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == offset_datetime) {
    return (offset_datetime_format_info *)((long)&this->field_1 + 0x10);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_offset_datetime_fmt()","");
  throw_bad_cast(this,&local_38,offset_datetime);
}

Assistant:

offset_datetime_format_info const& as_offset_datetime_fmt() const
    {
        if(this->type_ != value_t::offset_datetime)
        {
            this->throw_bad_cast("toml::value::as_offset_datetime_fmt()", value_t::offset_datetime);
        }
        return this->offset_datetime_.format;
    }